

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceFinder.cc
# Opt level: O1

void __thiscall ResourceFinder::ResourceFinder(ResourceFinder *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_ParserCallbacks)._vptr_ParserCallbacks = (_func_int **)&PTR__ResourceFinder_002f2dd8;
  (this->last_name)._M_dataplus._M_p = (pointer)&(this->last_name).field_2;
  (this->last_name)._M_string_length = 0;
  (this->last_name).field_2._M_local_buf[0] = '\0';
  this->last_name_offset = 0;
  p_Var1 = &(this->names)._M_t._M_impl.super__Rb_tree_header;
  (this->names)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->names)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->names)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->names)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->names_by_resource_type)._M_t._M_impl.super__Rb_tree_header;
  (this->names_by_resource_type)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->names_by_resource_type)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->names_by_resource_type)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->names_by_resource_type)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->names_by_resource_type)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

ResourceFinder::ResourceFinder() :
    last_name_offset(0)
{
}